

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

void fill_ellipse(chunk *c,wchar_t y0,wchar_t x0,wchar_t y_radius,wchar_t x_radius,wchar_t feat,
                 wchar_t flag,_Bool light)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  bool bVar5;
  
  if (L'\xffffffff' < y_radius) {
    wVar3 = -y_radius;
    do {
      iVar1 = -1;
      iVar2 = 0;
      do {
        iVar4 = iVar2 * iVar2;
        iVar1 = iVar1 + 1;
        iVar2 = iVar2 + y_radius;
      } while (iVar4 + wVar3 * x_radius * wVar3 * x_radius <=
               x_radius * y_radius * x_radius * y_radius);
      fill_xrange(c,wVar3 + y0,x0 - iVar1,iVar1 + x0,feat,flag,light);
      bVar5 = wVar3 != y_radius;
      wVar3 = wVar3 + L'\x01';
    } while (bVar5);
  }
  return;
}

Assistant:

void fill_ellipse(struct chunk *c, int y0, int x0, int y_radius, int x_radius,
				  int feat, int flag, bool light)
{
	int y;
	for (y = -y_radius; y <= y_radius; y++) {
		int x = 0;
		while (x * x * y_radius * y_radius + y * y * x_radius * x_radius <=
			   y_radius * y_radius * x_radius * x_radius) {
			x++;
		}

		fill_xrange(c, y0 + y, x0 - x, x0 + x, feat, flag, light);
	}
}